

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::SubGridIntersectorKMoeller<4,_4,_true>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  ushort uVar7;
  ushort uVar8;
  BVH *bvh;
  size_t sVar9;
  Geometry *pGVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  Ref<embree::Geometry> *pRVar14;
  long lVar15;
  bool bVar16;
  bool bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  byte bVar29;
  vfloat<4> vVar30;
  uint uVar31;
  int iVar32;
  long lVar33;
  ulong uVar34;
  RayK<4> *pRVar35;
  long lVar36;
  uint uVar37;
  undefined4 uVar38;
  RTCIntersectArguments *pRVar39;
  long lVar40;
  ulong uVar41;
  long lVar42;
  NodeRef root;
  size_t sVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  long lVar47;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar48;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar49;
  float *pfVar50;
  ulong uVar51;
  NodeRef *pNVar52;
  bool bVar53;
  float fVar54;
  float fVar74;
  float fVar75;
  vint4 bi_1;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar76;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar73;
  byte bVar77;
  float fVar78;
  byte bVar93;
  byte bVar94;
  byte bVar96;
  float fVar97;
  byte bVar98;
  byte bVar99;
  float fVar100;
  vint4 bi;
  undefined1 auVar79 [16];
  float fVar101;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  byte bVar95;
  undefined1 auVar82 [16];
  float fVar102;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar88;
  undefined1 auVar89 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar103;
  float fVar104;
  float fVar116;
  float fVar118;
  vint4 ai;
  float fVar120;
  undefined1 auVar105 [16];
  float fVar117;
  float fVar119;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar131;
  float fVar134;
  vint4 ai_1;
  undefined1 auVar123 [16];
  float fVar136;
  undefined1 auVar124 [16];
  float fVar132;
  float fVar135;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar133 [12];
  float fVar121;
  float fVar122;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar137;
  float fVar138;
  float fVar142;
  float fVar144;
  vint4 ai_3;
  float fVar143;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  uint uVar152;
  uint uVar153;
  vint4 bi_2;
  undefined1 auVar148 [16];
  uint uVar154;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar155;
  float fVar156;
  uint uVar157;
  float fVar158;
  float fVar162;
  float fVar165;
  vint4 bi_3;
  float fVar163;
  uint uVar164;
  float fVar166;
  uint uVar167;
  float fVar168;
  float fVar169;
  uint uVar170;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  uint uVar171;
  float fVar172;
  uint uVar176;
  uint uVar178;
  vint4 ai_2;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar177;
  float fVar179;
  uint uVar180;
  float fVar181;
  uint uVar182;
  undefined1 auVar175 [16];
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  uint uVar188;
  float fVar189;
  float fVar190;
  uint uVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar199 [16];
  uint uVar200;
  uint uVar201;
  uint uVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  TravRayK<4,_false> *tray_00;
  undefined1 local_1ba8 [16];
  float local_1b98;
  float fStack_1b94;
  float fStack_1b90;
  float fStack_1b8c;
  Precalculations pre;
  undefined1 local_1b78 [8];
  float fStack_1b70;
  float fStack_1b6c;
  undefined1 local_1b68 [8];
  float fStack_1b60;
  float fStack_1b5c;
  undefined1 local_1b58 [16];
  undefined1 local_1b48 [16];
  float local_1b38;
  float fStack_1b34;
  float fStack_1b30;
  float fStack_1b2c;
  float local_1b18;
  float fStack_1b14;
  float fStack_1b10;
  float fStack_1b0c;
  vfloat<4> upper_y;
  vbool<4> terminated;
  vfloat<4> lower_y;
  undefined1 local_1a48 [16];
  vfloat<4> upper_z;
  vfloat<4> lower_z;
  TravRayK<4,_false> tray;
  vfloat<4> upper_x;
  vfloat<4> lower_x;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined8 local_1738;
  undefined8 uStack_1730;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar191 [16];
  
  auVar92 = mm_lookupmask_ps._0_16_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    pRVar39 = (RTCIntersectArguments *)context;
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       (pRVar39 = context->args, ((ulong)*(Scene **)&pRVar39->flags & 0x10000) != 0)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar129._8_4_ = 0xffffffff;
    auVar129._0_8_ = 0xffffffffffffffff;
    auVar129._12_4_ = 0xffffffff;
    auVar81 = *(undefined1 (*) [16])(ray + 0x80);
    auVar123._0_12_ = ZEXT812(0);
    auVar123._12_4_ = 0;
    uVar188 = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar81._0_4_);
    uVar192 = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar81._4_4_);
    auVar191._0_8_ = CONCAT44(uVar192,uVar188);
    auVar191._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar81._8_4_);
    auVar191._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar81._12_4_);
    uVar37 = movmskps((int)pRVar39,auVar191);
    pRVar39 = (RTCIntersectArguments *)(ulong)uVar37;
    if (uVar37 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar155 = (float)DAT_01ff1d40;
      fVar162 = DAT_01ff1d40._4_4_;
      fVar165 = DAT_01ff1d40._8_4_;
      fVar168 = DAT_01ff1d40._12_4_;
      auVar56._4_4_ = -(uint)(ABS(tray.dir.field_0._4_4_) < fVar162);
      auVar56._0_4_ = -(uint)(ABS(tray.dir.field_0._0_4_) < fVar155);
      auVar56._8_4_ = -(uint)(ABS(tray.dir.field_0._8_4_) < fVar165);
      auVar56._12_4_ = -(uint)(ABS(tray.dir.field_0._12_4_) < fVar168);
      auVar173 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01ff1d40,auVar56
                         );
      auVar79._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < fVar162);
      auVar79._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < fVar155);
      auVar79._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < fVar165);
      auVar79._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < fVar168);
      auVar79 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01ff1d40,auVar79)
      ;
      auVar55._4_4_ = -(uint)(ABS(tray.dir.field_0._36_4_) < fVar162);
      auVar55._0_4_ = -(uint)(ABS(tray.dir.field_0._32_4_) < fVar155);
      auVar55._8_4_ = -(uint)(ABS(tray.dir.field_0._40_4_) < fVar165);
      auVar55._12_4_ = -(uint)(ABS(tray.dir.field_0._44_4_) < fVar168);
      auVar148 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01ff1d40,auVar55
                         );
      auVar56 = rcpps(auVar55,auVar173);
      fVar155 = auVar56._0_4_;
      auVar174._0_4_ = auVar173._0_4_ * fVar155;
      fVar162 = auVar56._4_4_;
      auVar174._4_4_ = auVar173._4_4_ * fVar162;
      fVar165 = auVar56._8_4_;
      auVar174._8_4_ = auVar173._8_4_ * fVar165;
      fVar168 = auVar56._12_4_;
      auVar174._12_4_ = auVar173._12_4_ * fVar168;
      tray.rdir.field_0._0_4_ = (1.0 - auVar174._0_4_) * fVar155 + fVar155;
      tray.rdir.field_0._4_4_ = (1.0 - auVar174._4_4_) * fVar162 + fVar162;
      tray.rdir.field_0._8_4_ = (1.0 - auVar174._8_4_) * fVar165 + fVar165;
      tray.rdir.field_0._12_4_ = (1.0 - auVar174._12_4_) * fVar168 + fVar168;
      auVar56 = rcpps(auVar174,auVar79);
      fVar155 = auVar56._0_4_;
      fVar162 = auVar56._4_4_;
      fVar165 = auVar56._8_4_;
      fVar168 = auVar56._12_4_;
      tray.rdir.field_0._16_4_ = (1.0 - auVar79._0_4_ * fVar155) * fVar155 + fVar155;
      tray.rdir.field_0._20_4_ = (1.0 - auVar79._4_4_ * fVar162) * fVar162 + fVar162;
      tray.rdir.field_0._24_4_ = (1.0 - auVar79._8_4_ * fVar165) * fVar165 + fVar165;
      tray.rdir.field_0._28_4_ = (1.0 - auVar79._12_4_ * fVar168) * fVar168 + fVar168;
      auVar56 = rcpps(auVar56,auVar148);
      fVar155 = auVar56._0_4_;
      fVar162 = auVar56._4_4_;
      fVar165 = auVar56._8_4_;
      fVar168 = auVar56._12_4_;
      tray.rdir.field_0._32_4_ = (1.0 - auVar148._0_4_ * fVar155) * fVar155 + fVar155;
      tray.rdir.field_0._36_4_ = (1.0 - auVar148._4_4_ * fVar162) * fVar162 + fVar162;
      tray.rdir.field_0._40_4_ = (1.0 - auVar148._8_4_ * fVar165) * fVar165 + fVar165;
      tray.rdir.field_0._44_4_ = (1.0 - auVar148._12_4_ * fVar168) * fVar168 + fVar168;
      auVar148._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar148._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar148._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar148._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fed0,_DAT_01ffd210,auVar148);
      tray.nearXYZ.field_0._0_4_ = -(uint)((float)tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)((float)tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar173._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar173._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar173._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar173._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fef0,_DAT_0201fee0,auVar173);
      auVar56 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar123);
      auVar123 = maxps(auVar81,auVar123);
      auVar81._8_4_ = auVar191._8_4_;
      auVar81._0_8_ = auVar191._0_8_;
      auVar81._12_4_ = auVar191._12_4_;
      fVar155 = (float)DAT_01feb9f0;
      fVar162 = DAT_01feb9f0._4_4_;
      fVar165 = DAT_01feb9f0._8_4_;
      fVar168 = DAT_01feb9f0._12_4_;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01feb9f0,auVar56,auVar81);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01feba00,auVar123,auVar81);
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar129 ^ auVar191);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar37 = 3;
      }
      else {
        uVar37 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar52 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01feb9f0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      iVar32 = 0x224ff80;
      paVar48 = &stack_near[2].field_0;
      do {
        paVar49 = paVar48 + -1;
        root.ptr = pNVar52[-1].ptr;
        pNVar52 = pNVar52 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_0025c1e9:
          iVar32 = 3;
        }
        else {
          local_1b68._0_4_ = paVar49->v[0];
          local_1b68._4_4_ = *(float *)((long)paVar48 + -0xc);
          fStack_1b60 = *(float *)((long)paVar48 + -8);
          fStack_1b5c = *(float *)((long)paVar48 + -4);
          vVar30.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar49->v;
          auVar57._4_4_ = -(uint)((float)local_1b68._4_4_ < tray.tfar.field_0.v[1]);
          auVar57._0_4_ = -(uint)((float)local_1b68._0_4_ < tray.tfar.field_0.v[0]);
          auVar57._8_4_ = -(uint)(fStack_1b60 < tray.tfar.field_0.v[2]);
          auVar57._12_4_ = -(uint)(fStack_1b5c < tray.tfar.field_0.v[3]);
          uVar31 = movmskps(iVar32,auVar57);
          if (uVar31 == 0) {
LAB_0025c1fa:
            iVar32 = 2;
          }
          else {
            uVar44 = (ulong)(uVar31 & 0xff);
            uVar31 = POPCOUNT(uVar31 & 0xff);
            iVar32 = 0;
            if (uVar31 <= uVar37) {
              do {
                sVar43 = 0;
                if (uVar44 != 0) {
                  for (; (uVar44 >> sVar43 & 1) == 0; sVar43 = sVar43 + 1) {
                  }
                }
                tray_00 = &tray;
                valid_i = (vint<4> *)This;
                bVar53 = occluded1(This,bvh,root,sVar43,&pre,ray,tray_00,context);
                if (bVar53) {
                  terminated.field_0.i[sVar43] = -1;
                }
                uVar44 = uVar44 & uVar44 - 1;
              } while (uVar44 != 0);
              uVar152 = movmskps((int)tray_00,(undefined1  [16])terminated.field_0);
              pRVar39 = (RTCIntersectArguments *)(ulong)uVar152;
              iVar32 = 3;
              fVar155 = INFINITY;
              fVar162 = INFINITY;
              fVar165 = INFINITY;
              fVar168 = INFINITY;
              local_1b68._0_4_ = vVar30.field_0._0_4_;
              local_1b68._4_4_ = vVar30.field_0._4_4_;
              fStack_1b60 = vVar30.field_0._8_4_;
              fStack_1b5c = vVar30.field_0._12_4_;
              if (uVar152 != 0xf) {
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                              (undefined1  [16])terminated.field_0);
                iVar32 = 2;
              }
            }
            if (uVar37 < uVar31) {
              do {
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_0025c1e9;
                  auVar60._4_4_ = -(uint)((float)local_1b68._4_4_ < tray.tfar.field_0.v[1]);
                  auVar60._0_4_ = -(uint)((float)local_1b68._0_4_ < tray.tfar.field_0.v[0]);
                  auVar60._8_4_ = -(uint)(fStack_1b60 < tray.tfar.field_0.v[2]);
                  auVar60._12_4_ = -(uint)(fStack_1b5c < tray.tfar.field_0.v[3]);
                  iVar32 = movmskps(iVar32,auVar60);
                  if (iVar32 != 0) {
                    lVar33 = (ulong)((uint)root.ptr & 0xf) - 8;
                    lVar36 = lVar33;
                    aVar73 = terminated.field_0;
                    if (lVar33 != 0) {
                      uVar44 = root.ptr & 0xfffffffffffffff0;
                      local_1a48._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                      local_1a48._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
                      local_1a48._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
                      lVar36 = 0;
                      do {
                        lVar40 = lVar36 * 0x58;
                        uVar45 = *(ulong *)(uVar44 + 0x20 + lVar40);
                        auVar61._8_8_ = 0;
                        auVar61._0_8_ = uVar45;
                        uVar6 = *(undefined8 *)(uVar44 + 0x24 + lVar40);
                        bVar18 = (byte)uVar45;
                        bVar77 = (byte)uVar6;
                        bVar19 = (byte)(uVar45 >> 8);
                        bVar93 = (byte)((ulong)uVar6 >> 8);
                        bVar20 = (byte)(uVar45 >> 0x10);
                        bVar94 = (byte)((ulong)uVar6 >> 0x10);
                        bVar21 = (byte)(uVar45 >> 0x18);
                        bVar95 = (byte)((ulong)uVar6 >> 0x18);
                        bVar22 = (byte)(uVar45 >> 0x20);
                        bVar96 = (byte)((ulong)uVar6 >> 0x20);
                        bVar23 = (byte)(uVar45 >> 0x28);
                        bVar98 = (byte)((ulong)uVar6 >> 0x28);
                        bVar24 = (byte)(uVar45 >> 0x30);
                        bVar99 = (byte)((ulong)uVar6 >> 0x30);
                        bVar29 = (byte)((ulong)uVar6 >> 0x38);
                        bVar25 = (byte)(uVar45 >> 0x38);
                        auVar82[0] = -((byte)((bVar18 < bVar77) * bVar18 |
                                             (bVar18 >= bVar77) * bVar77) == bVar18);
                        auVar82[1] = -((byte)((bVar19 < bVar93) * bVar19 |
                                             (bVar19 >= bVar93) * bVar93) == bVar19);
                        auVar82[2] = -((byte)((bVar20 < bVar94) * bVar20 |
                                             (bVar20 >= bVar94) * bVar94) == bVar20);
                        auVar82[3] = -((byte)((bVar21 < bVar95) * bVar21 |
                                             (bVar21 >= bVar95) * bVar95) == bVar21);
                        auVar82[4] = -((byte)((bVar22 < bVar96) * bVar22 |
                                             (bVar22 >= bVar96) * bVar96) == bVar22);
                        auVar82[5] = -((byte)((bVar23 < bVar98) * bVar23 |
                                             (bVar23 >= bVar98) * bVar98) == bVar23);
                        auVar82[6] = -((byte)((bVar24 < bVar99) * bVar24 |
                                             (bVar24 >= bVar99) * bVar99) == bVar24);
                        auVar82[7] = -((byte)((bVar25 < bVar29) * bVar25 |
                                             (bVar25 >= bVar29) * bVar29) == bVar25);
                        auVar82[8] = 0xff;
                        auVar82[9] = 0xff;
                        auVar82[10] = 0xff;
                        auVar82[0xb] = 0xff;
                        auVar82[0xc] = 0xff;
                        auVar82[0xd] = 0xff;
                        auVar82[0xe] = 0xff;
                        auVar82[0xf] = 0xff;
                        auVar105._8_4_ = 0xffffffff;
                        auVar105._0_8_ = 0xffffffffffffffff;
                        auVar105._12_4_ = 0xffffffff;
                        auVar81 = pmovzxbd(auVar61,auVar82 ^ auVar105);
                        auVar81 = auVar81 ^ auVar105;
                        auVar62._0_4_ = auVar81._0_4_ << 0x1f;
                        auVar62._4_4_ = auVar81._4_4_ << 0x1f;
                        auVar62._8_4_ = auVar81._8_4_ << 0x1f;
                        auVar62._12_4_ = auVar81._12_4_ << 0x1f;
                        uVar31 = movmskps((int)lVar36,auVar62);
                        if (uVar31 != 0) {
                          lVar40 = lVar40 + uVar44;
                          uVar45 = (ulong)(uVar31 & 0xff);
                          do {
                            lVar15 = 0;
                            if (uVar45 != 0) {
                              for (; (uVar45 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
                              }
                            }
                            auVar63._8_8_ = 0;
                            auVar63._0_8_ = *(ulong *)(lVar40 + 0x20);
                            auVar81 = pmovzxbd(auVar63,auVar63);
                            fVar169 = *(float *)(lVar40 + 0x38);
                            fVar54 = *(float *)(lVar40 + 0x44);
                            lower_x.field_0.v[1] = (float)auVar81._4_4_ * fVar54 + fVar169;
                            lower_x.field_0.v[0] = (float)auVar81._0_4_ * fVar54 + fVar169;
                            lower_x.field_0.v[3] = (float)auVar81._12_4_ * fVar54 + fVar169;
                            lower_x.field_0.v[2] = (float)auVar81._8_4_ * fVar54 + fVar169;
                            auVar64._8_8_ = 0;
                            auVar64._0_8_ = *(ulong *)(lVar40 + 0x24);
                            auVar81 = pmovzxbd(auVar64,auVar64);
                            upper_x.field_0.v[0] = (float)auVar81._0_4_ * fVar54 + fVar169;
                            upper_x.field_0.v[1] = (float)auVar81._4_4_ * fVar54 + fVar169;
                            upper_x.field_0.v[2] = (float)auVar81._8_4_ * fVar54 + fVar169;
                            upper_x.field_0.v[3] = (float)auVar81._12_4_ * fVar54 + fVar169;
                            auVar65._8_8_ = 0;
                            auVar65._0_8_ = *(ulong *)(lVar40 + 0x28);
                            auVar81 = pmovzxbd(auVar65,auVar65);
                            fVar169 = *(float *)(lVar40 + 0x3c);
                            fVar54 = *(float *)(lVar40 + 0x48);
                            lower_y.field_0.v[1] = (float)auVar81._4_4_ * fVar54 + fVar169;
                            lower_y.field_0.v[0] = (float)auVar81._0_4_ * fVar54 + fVar169;
                            lower_y.field_0.v[3] = (float)auVar81._12_4_ * fVar54 + fVar169;
                            lower_y.field_0.v[2] = (float)auVar81._8_4_ * fVar54 + fVar169;
                            auVar66._8_8_ = 0;
                            auVar66._0_8_ = *(ulong *)(lVar40 + 0x2c);
                            auVar81 = pmovzxbd(auVar66,auVar66);
                            upper_y.field_0.v[1] = (float)auVar81._4_4_ * fVar54 + fVar169;
                            upper_y.field_0.v[0] = (float)auVar81._0_4_ * fVar54 + fVar169;
                            upper_y.field_0.v[2] = (float)auVar81._8_4_ * fVar54 + fVar169;
                            upper_y.field_0.v[3] = (float)auVar81._12_4_ * fVar54 + fVar169;
                            auVar67._8_8_ = 0;
                            auVar67._0_8_ = *(ulong *)(lVar40 + 0x30);
                            auVar81 = pmovzxbd(auVar67,auVar67);
                            fVar169 = *(float *)(lVar40 + 0x40);
                            fVar54 = *(float *)(lVar40 + 0x4c);
                            lower_z.field_0.v[1] = (float)auVar81._4_4_ * fVar54 + fVar169;
                            lower_z.field_0.v[0] = (float)auVar81._0_4_ * fVar54 + fVar169;
                            lower_z.field_0.v[3] = (float)auVar81._12_4_ * fVar54 + fVar169;
                            lower_z.field_0.v[2] = (float)auVar81._8_4_ * fVar54 + fVar169;
                            auVar68._8_8_ = 0;
                            auVar68._0_8_ = *(ulong *)(lVar40 + 0x34);
                            auVar81 = pmovzxbd(auVar68,auVar68);
                            upper_z.field_0.v[1] = (float)auVar81._4_4_ * fVar54 + fVar169;
                            upper_z.field_0.v[0] = (float)auVar81._0_4_ * fVar54 + fVar169;
                            upper_z.field_0.v[3] = (float)auVar81._12_4_ * fVar54 + fVar169;
                            upper_z.field_0.v[2] = (float)auVar81._8_4_ * fVar54 + fVar169;
                            fVar169 = lower_x.field_0.v[lVar15];
                            fVar54 = (fVar169 - (float)tray.org.field_0._0_4_) *
                                     (float)tray.rdir.field_0._0_4_;
                            fVar74 = (fVar169 - (float)tray.org.field_0._4_4_) *
                                     (float)tray.rdir.field_0._4_4_;
                            fVar76 = (fVar169 - (float)tray.org.field_0._8_4_) *
                                     (float)tray.rdir.field_0._8_4_;
                            fVar75 = (fVar169 - (float)tray.org.field_0._12_4_) *
                                     (float)tray.rdir.field_0._12_4_;
                            fVar169 = lower_y.field_0.v[lVar15];
                            fVar78 = (fVar169 - (float)tray.org.field_0._16_4_) *
                                     (float)tray.rdir.field_0._16_4_;
                            fVar97 = (fVar169 - (float)tray.org.field_0._20_4_) *
                                     (float)tray.rdir.field_0._20_4_;
                            fVar100 = (fVar169 - (float)tray.org.field_0._24_4_) *
                                      (float)tray.rdir.field_0._24_4_;
                            fVar101 = (fVar169 - (float)tray.org.field_0._28_4_) *
                                      (float)tray.rdir.field_0._28_4_;
                            fVar169 = lower_z.field_0.v[lVar15];
                            fVar103 = (fVar169 - (float)tray.org.field_0._32_4_) *
                                      (float)tray.rdir.field_0._32_4_;
                            fVar116 = (fVar169 - (float)tray.org.field_0._36_4_) *
                                      (float)tray.rdir.field_0._36_4_;
                            fVar118 = (fVar169 - (float)tray.org.field_0._40_4_) *
                                      (float)tray.rdir.field_0._40_4_;
                            fVar120 = (fVar169 - (float)tray.org.field_0._44_4_) *
                                      (float)tray.rdir.field_0._44_4_;
                            fVar169 = upper_x.field_0.v[lVar15];
                            fVar121 = (fVar169 - (float)tray.org.field_0._0_4_) *
                                      (float)tray.rdir.field_0._0_4_;
                            fVar131 = (fVar169 - (float)tray.org.field_0._4_4_) *
                                      (float)tray.rdir.field_0._4_4_;
                            fVar134 = (fVar169 - (float)tray.org.field_0._8_4_) *
                                      (float)tray.rdir.field_0._8_4_;
                            fVar136 = (fVar169 - (float)tray.org.field_0._12_4_) *
                                      (float)tray.rdir.field_0._12_4_;
                            fVar169 = upper_y.field_0.v[lVar15];
                            fVar146 = (fVar169 - (float)tray.org.field_0._16_4_) *
                                      (float)tray.rdir.field_0._16_4_;
                            fVar156 = (fVar169 - (float)tray.org.field_0._20_4_) *
                                      (float)tray.rdir.field_0._20_4_;
                            fVar163 = (fVar169 - (float)tray.org.field_0._24_4_) *
                                      (float)tray.rdir.field_0._24_4_;
                            fVar166 = (fVar169 - (float)tray.org.field_0._28_4_) *
                                      (float)tray.rdir.field_0._28_4_;
                            fVar169 = upper_z.field_0.v[lVar15];
                            fVar137 = (fVar169 - (float)tray.org.field_0._32_4_) *
                                      (float)tray.rdir.field_0._32_4_;
                            fVar142 = (fVar169 - (float)tray.org.field_0._36_4_) *
                                      (float)tray.rdir.field_0._36_4_;
                            fVar144 = (fVar169 - (float)tray.org.field_0._40_4_) *
                                      (float)tray.rdir.field_0._40_4_;
                            fVar169 = (fVar169 - (float)tray.org.field_0._44_4_) *
                                      (float)tray.rdir.field_0._44_4_;
                            uVar31 = (uint)((int)fVar121 < (int)fVar54) * (int)fVar121 |
                                     (uint)((int)fVar121 >= (int)fVar54) * (int)fVar54;
                            uVar152 = (uint)((int)fVar131 < (int)fVar74) * (int)fVar131 |
                                      (uint)((int)fVar131 >= (int)fVar74) * (int)fVar74;
                            uVar153 = (uint)((int)fVar134 < (int)fVar76) * (int)fVar134 |
                                      (uint)((int)fVar134 >= (int)fVar76) * (int)fVar76;
                            uVar154 = (uint)((int)fVar136 < (int)fVar75) * (int)fVar136 |
                                      (uint)((int)fVar136 >= (int)fVar75) * (int)fVar75;
                            uVar171 = (uint)((int)fVar146 < (int)fVar78) * (int)fVar146 |
                                      (uint)((int)fVar146 >= (int)fVar78) * (int)fVar78;
                            uVar176 = (uint)((int)fVar156 < (int)fVar97) * (int)fVar156 |
                                      (uint)((int)fVar156 >= (int)fVar97) * (int)fVar97;
                            uVar178 = (uint)((int)fVar163 < (int)fVar100) * (int)fVar163 |
                                      (uint)((int)fVar163 >= (int)fVar100) * (int)fVar100;
                            uVar180 = (uint)((int)fVar166 < (int)fVar101) * (int)fVar166 |
                                      (uint)((int)fVar166 >= (int)fVar101) * (int)fVar101;
                            uVar171 = ((int)uVar171 < (int)uVar31) * uVar31 |
                                      ((int)uVar171 >= (int)uVar31) * uVar171;
                            uVar176 = ((int)uVar176 < (int)uVar152) * uVar152 |
                                      ((int)uVar176 >= (int)uVar152) * uVar176;
                            uVar178 = ((int)uVar178 < (int)uVar153) * uVar153 |
                                      ((int)uVar178 >= (int)uVar153) * uVar178;
                            uVar180 = ((int)uVar180 < (int)uVar154) * uVar154 |
                                      ((int)uVar180 >= (int)uVar154) * uVar180;
                            uVar31 = (uint)((int)fVar137 < (int)fVar103) * (int)fVar137 |
                                     (uint)((int)fVar137 >= (int)fVar103) * (int)fVar103;
                            uVar152 = (uint)((int)fVar142 < (int)fVar116) * (int)fVar142 |
                                      (uint)((int)fVar142 >= (int)fVar116) * (int)fVar116;
                            uVar153 = (uint)((int)fVar144 < (int)fVar118) * (int)fVar144 |
                                      (uint)((int)fVar144 >= (int)fVar118) * (int)fVar118;
                            uVar154 = (uint)((int)fVar169 < (int)fVar120) * (int)fVar169 |
                                      (uint)((int)fVar169 >= (int)fVar120) * (int)fVar120;
                            uVar31 = ((int)uVar31 < (int)uVar171) * uVar171 |
                                     ((int)uVar31 >= (int)uVar171) * uVar31;
                            uVar152 = ((int)uVar152 < (int)uVar176) * uVar176 |
                                      ((int)uVar152 >= (int)uVar176) * uVar152;
                            uVar153 = ((int)uVar153 < (int)uVar178) * uVar178 |
                                      ((int)uVar153 >= (int)uVar178) * uVar153;
                            uVar154 = ((int)uVar154 < (int)uVar180) * uVar180 |
                                      ((int)uVar154 >= (int)uVar180) * uVar154;
                            uVar171 = (uint)((int)fVar121 < (int)fVar54) * (int)fVar54 |
                                      (uint)((int)fVar121 >= (int)fVar54) * (int)fVar121;
                            uVar176 = (uint)((int)fVar131 < (int)fVar74) * (int)fVar74 |
                                      (uint)((int)fVar131 >= (int)fVar74) * (int)fVar131;
                            uVar178 = (uint)((int)fVar134 < (int)fVar76) * (int)fVar76 |
                                      (uint)((int)fVar134 >= (int)fVar76) * (int)fVar134;
                            uVar180 = (uint)((int)fVar136 < (int)fVar75) * (int)fVar75 |
                                      (uint)((int)fVar136 >= (int)fVar75) * (int)fVar136;
                            uVar157 = (uint)((int)fVar146 < (int)fVar78) * (int)fVar78 |
                                      (uint)((int)fVar146 >= (int)fVar78) * (int)fVar146;
                            uVar164 = (uint)((int)fVar156 < (int)fVar97) * (int)fVar97 |
                                      (uint)((int)fVar156 >= (int)fVar97) * (int)fVar156;
                            uVar167 = (uint)((int)fVar163 < (int)fVar100) * (int)fVar100 |
                                      (uint)((int)fVar163 >= (int)fVar100) * (int)fVar163;
                            uVar170 = (uint)((int)fVar166 < (int)fVar101) * (int)fVar101 |
                                      (uint)((int)fVar166 >= (int)fVar101) * (int)fVar166;
                            uVar157 = ((int)uVar171 < (int)uVar157) * uVar171 |
                                      ((int)uVar171 >= (int)uVar157) * uVar157;
                            uVar164 = ((int)uVar176 < (int)uVar164) * uVar176 |
                                      ((int)uVar176 >= (int)uVar164) * uVar164;
                            uVar167 = ((int)uVar178 < (int)uVar167) * uVar178 |
                                      ((int)uVar178 >= (int)uVar167) * uVar167;
                            uVar170 = ((int)uVar180 < (int)uVar170) * uVar180 |
                                      ((int)uVar180 >= (int)uVar170) * uVar170;
                            uVar171 = (uint)((int)fVar137 < (int)fVar103) * (int)fVar103 |
                                      (uint)((int)fVar137 >= (int)fVar103) * (int)fVar137;
                            uVar176 = (uint)((int)fVar142 < (int)fVar116) * (int)fVar116 |
                                      (uint)((int)fVar142 >= (int)fVar116) * (int)fVar142;
                            uVar178 = (uint)((int)fVar144 < (int)fVar118) * (int)fVar118 |
                                      (uint)((int)fVar144 >= (int)fVar118) * (int)fVar144;
                            uVar180 = (uint)((int)fVar169 < (int)fVar120) * (int)fVar120 |
                                      (uint)((int)fVar169 >= (int)fVar120) * (int)fVar169;
                            uVar171 = ((int)uVar157 < (int)uVar171) * uVar157 |
                                      ((int)uVar157 >= (int)uVar171) * uVar171;
                            uVar176 = ((int)uVar164 < (int)uVar176) * uVar164 |
                                      ((int)uVar164 >= (int)uVar176) * uVar176;
                            uVar178 = ((int)uVar167 < (int)uVar178) * uVar167 |
                                      ((int)uVar167 >= (int)uVar178) * uVar178;
                            uVar180 = ((int)uVar170 < (int)uVar180) * uVar170 |
                                      ((int)uVar170 >= (int)uVar180) * uVar180;
                            uVar157 = local_1a48._0_4_;
                            uVar164 = local_1a48._4_4_;
                            uVar167 = local_1a48._8_4_;
                            uVar170 = local_1a48._12_4_;
                            auVar124._0_4_ =
                                 -(uint)((float)((uint)((int)uVar31 < tray.tnear.field_0.i[0]) *
                                                 tray.tnear.field_0.i[0] |
                                                ((int)uVar31 >= tray.tnear.field_0.i[0]) * uVar31)
                                        <= (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar171) *
                                                   tray.tfar.field_0.i[0] |
                                                  (tray.tfar.field_0.i[0] >= (int)uVar171) * uVar171
                                                  )) & uVar157;
                            auVar124._4_4_ =
                                 -(uint)((float)((uint)((int)uVar152 < tray.tnear.field_0.i[1]) *
                                                 tray.tnear.field_0.i[1] |
                                                ((int)uVar152 >= tray.tnear.field_0.i[1]) * uVar152)
                                        <= (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar176) *
                                                   tray.tfar.field_0.i[1] |
                                                  (tray.tfar.field_0.i[1] >= (int)uVar176) * uVar176
                                                  )) & uVar164;
                            auVar124._8_4_ =
                                 -(uint)((float)((uint)((int)uVar153 < tray.tnear.field_0.i[2]) *
                                                 tray.tnear.field_0.i[2] |
                                                ((int)uVar153 >= tray.tnear.field_0.i[2]) * uVar153)
                                        <= (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar178) *
                                                   tray.tfar.field_0.i[2] |
                                                  (tray.tfar.field_0.i[2] >= (int)uVar178) * uVar178
                                                  )) & uVar167;
                            auVar124._12_4_ =
                                 -(uint)((float)((uint)((int)uVar154 < tray.tnear.field_0.i[3]) *
                                                 tray.tnear.field_0.i[3] |
                                                ((int)uVar154 >= tray.tnear.field_0.i[3]) * uVar154)
                                        <= (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar180) *
                                                   tray.tfar.field_0.i[3] |
                                                  (tray.tfar.field_0.i[3] >= (int)uVar180) * uVar180
                                                  )) & uVar170;
                            uVar31 = movmskps((int)pRVar39,auVar124);
                            pRVar39 = (RTCIntersectArguments *)(ulong)uVar31;
                            if (uVar31 == 0) {
                              bVar53 = false;
                            }
                            else {
                              uVar7 = *(ushort *)(lVar40 + lVar15 * 8);
                              uVar8 = *(ushort *)(lVar40 + 2 + lVar15 * 8);
                              uVar31 = *(uint *)(lVar40 + 0x50);
                              uVar152 = *(uint *)(lVar40 + 4 + lVar15 * 8);
                              pGVar10 = (context->scene->geometries).items[uVar31].ptr;
                              lVar11 = *(long *)&pGVar10->field_0x58;
                              lVar12 = *(long *)&pGVar10[1].time_range.upper;
                              valid_i = (vint<4> *)
                                        ((ulong)uVar152 *
                                        pGVar10[1].super_RefCount.refCounter.
                                        super___atomic_base<unsigned_long>._M_i);
                              uVar154 = uVar7 & 0x7fff;
                              uVar34 = (ulong)uVar154;
                              uVar171 = uVar8 & 0x7fff;
                              pRVar39 = (RTCIntersectArguments *)(ulong)uVar171;
                              uVar153 = *(uint *)((long)&((Intersectors *)valid_i)->ptr + lVar11 + 4
                                                 );
                              uVar46 = (ulong)uVar153;
                              uVar51 = (ulong)(uVar153 * uVar171 +
                                              *(int *)((long)&((Intersectors *)valid_i)->ptr +
                                                      lVar11) + uVar154);
                              p_Var13 = pGVar10[1].intersectionFilterN;
                              puVar1 = (undefined8 *)(lVar12 + (long)p_Var13 * uVar51);
                              puVar2 = (undefined8 *)(lVar12 + (uVar51 + 1) * (long)p_Var13);
                              lVar15 = uVar51 + uVar46;
                              lVar47 = uVar51 + uVar46 + 1;
                              puVar3 = (undefined8 *)(lVar12 + lVar15 * (long)p_Var13);
                              local_17a8 = *puVar3;
                              uStack_17a0 = puVar3[1];
                              puVar3 = (undefined8 *)(lVar12 + lVar47 * (long)p_Var13);
                              local_1768 = *puVar3;
                              uStack_1760 = puVar3[1];
                              uVar41 = (ulong)(-1 < (short)uVar7);
                              puVar3 = (undefined8 *)
                                       (lVar12 + (uVar51 + uVar41 + 1) * (long)p_Var13);
                              lVar42 = uVar41 + lVar47;
                              puVar4 = (undefined8 *)(lVar12 + lVar42 * (long)p_Var13);
                              local_1778 = *puVar4;
                              uStack_1770 = puVar4[1];
                              if ((short)uVar8 < 0) {
                                uVar46 = 0;
                              }
                              puVar4 = (undefined8 *)(lVar12 + (lVar15 + uVar46) * (long)p_Var13);
                              puVar5 = (undefined8 *)(lVar12 + (lVar47 + uVar46) * (long)p_Var13);
                              local_1738 = *puVar5;
                              uStack_1730 = puVar5[1];
                              puVar5 = (undefined8 *)(lVar12 + (uVar46 + lVar42) * (long)p_Var13);
                              lower_x.field_0._0_8_ = *puVar1;
                              lower_x.field_0._8_8_ = puVar1[1];
                              local_1798 = *puVar2;
                              uStack_1790 = puVar2[1];
                              local_1788 = *puVar3;
                              uStack_1780 = puVar3[1];
                              local_1758 = local_17a8;
                              uStack_1750 = uStack_17a0;
                              local_1748 = local_1768;
                              uStack_1740 = uStack_1760;
                              local_1728 = *puVar4;
                              uStack_1720 = puVar4[1];
                              local_1718 = local_1768;
                              uStack_1710 = uStack_1760;
                              local_1708 = local_1778;
                              uStack_1700 = uStack_1770;
                              local_16f8 = *puVar5;
                              uStack_16f0 = puVar5[1];
                              local_16e8 = local_1738;
                              uStack_16e0 = uStack_1730;
                              pfVar50 = (float *)&local_17a8;
                              uVar41 = 0;
                              do {
                                fVar155 = pfVar50[-0xc];
                                fVar162 = pfVar50[-0xb];
                                fVar165 = pfVar50[-10];
                                fVar168 = pfVar50[-8];
                                fVar169 = pfVar50[-7];
                                fVar54 = pfVar50[-6];
                                fVar74 = *pfVar50;
                                fVar76 = pfVar50[1];
                                fVar75 = pfVar50[2];
                                fVar211 = fVar162 - fVar169;
                                fVar214 = fVar162 - fVar169;
                                fVar217 = fVar162 - fVar169;
                                fVar220 = fVar162 - fVar169;
                                fVar189 = fVar165 - fVar54;
                                fVar193 = fVar165 - fVar54;
                                fVar195 = fVar165 - fVar54;
                                fVar197 = fVar165 - fVar54;
                                fVar156 = fVar76 - fVar162;
                                fVar163 = fVar76 - fVar162;
                                fVar166 = fVar76 - fVar162;
                                fVar102 = fVar76 - fVar162;
                                fVar172 = fVar75 - fVar165;
                                fVar177 = fVar75 - fVar165;
                                fVar179 = fVar75 - fVar165;
                                fVar181 = fVar75 - fVar165;
                                fVar137 = fVar189 * fVar156 - fVar211 * fVar172;
                                fVar142 = fVar193 * fVar163 - fVar214 * fVar177;
                                fVar144 = fVar195 * fVar166 - fVar217 * fVar179;
                                fVar146 = fVar197 * fVar102 - fVar220 * fVar181;
                                fVar158 = fVar74 - fVar155;
                                fVar183 = fVar155 - fVar168;
                                fVar138 = fVar183 * fVar172 - fVar189 * fVar158;
                                fVar143 = fVar183 * fVar177 - fVar193 * fVar158;
                                fVar145 = fVar183 * fVar179 - fVar195 * fVar158;
                                fVar147 = fVar183 * fVar181 - fVar197 * fVar158;
                                fVar212 = fVar211 * fVar158 - fVar183 * fVar156;
                                fVar215 = fVar214 * fVar158 - fVar183 * fVar163;
                                fVar218 = fVar217 * fVar158 - fVar183 * fVar166;
                                fVar221 = fVar220 * fVar158 - fVar183 * fVar102;
                                lower_z.field_0._0_8_ = CONCAT44(uVar31,uVar31);
                                lower_z.field_0._8_8_ = CONCAT44(uVar31,uVar31);
                                upper_z.field_0._0_8_ = CONCAT44(uVar152,uVar152);
                                upper_z.field_0._8_8_ = CONCAT44(uVar152,uVar152);
                                fVar104 = fVar162 - *(float *)(ray + 0x10);
                                fVar117 = fVar162 - *(float *)(ray + 0x14);
                                fVar119 = fVar162 - *(float *)(ray + 0x18);
                                fVar162 = fVar162 - *(float *)(ray + 0x1c);
                                fVar122 = fVar165 - *(float *)(ray + 0x20);
                                fVar132 = fVar165 - *(float *)(ray + 0x24);
                                fVar135 = fVar165 - *(float *)(ray + 0x28);
                                fVar165 = fVar165 - *(float *)(ray + 0x2c);
                                fVar78 = *(float *)(ray + 0x50);
                                fVar97 = *(float *)(ray + 0x54);
                                fVar100 = *(float *)(ray + 0x58);
                                fVar101 = *(float *)(ray + 0x5c);
                                fVar103 = *(float *)(ray + 0x60);
                                fVar116 = *(float *)(ray + 100);
                                fVar118 = *(float *)(ray + 0x68);
                                fVar120 = *(float *)(ray + 0x6c);
                                fVar184 = fVar104 * fVar103 - fVar122 * fVar78;
                                fVar185 = fVar117 * fVar116 - fVar132 * fVar97;
                                fVar186 = fVar119 * fVar118 - fVar135 * fVar100;
                                fVar187 = fVar162 * fVar120 - fVar165 * fVar101;
                                fVar203 = fVar155 - *(float *)ray;
                                fVar205 = fVar155 - *(float *)(ray + 4);
                                fVar207 = fVar155 - *(float *)(ray + 8);
                                fVar155 = fVar155 - *(float *)(ray + 0xc);
                                fVar121 = *(float *)(ray + 0x40);
                                fVar131 = *(float *)(ray + 0x44);
                                fVar134 = *(float *)(ray + 0x48);
                                fVar136 = *(float *)(ray + 0x4c);
                                fVar190 = fVar122 * fVar121 - fVar203 * fVar103;
                                fVar194 = fVar132 * fVar131 - fVar205 * fVar116;
                                fVar196 = fVar135 * fVar134 - fVar207 * fVar118;
                                fVar198 = fVar165 * fVar136 - fVar155 * fVar120;
                                fVar204 = fVar203 * fVar78 - fVar104 * fVar121;
                                fVar206 = fVar205 * fVar97 - fVar117 * fVar131;
                                fVar208 = fVar207 * fVar100 - fVar119 * fVar134;
                                fVar210 = fVar155 * fVar101 - fVar162 * fVar136;
                                fVar121 = fVar121 * fVar137 + fVar78 * fVar138 + fVar103 * fVar212;
                                fVar131 = fVar131 * fVar142 + fVar97 * fVar143 + fVar116 * fVar215;
                                fVar134 = fVar134 * fVar144 + fVar100 * fVar145 + fVar118 * fVar218;
                                fVar120 = fVar136 * fVar146 + fVar101 * fVar147 + fVar120 * fVar221;
                                uVar153 = (uint)fVar121 & 0x80000000;
                                uVar176 = (uint)fVar131 & 0x80000000;
                                uVar178 = (uint)fVar134 & 0x80000000;
                                uVar180 = (uint)fVar120 & 0x80000000;
                                fVar136 = (float)((uint)(fVar158 * fVar184 +
                                                        fVar156 * fVar190 + fVar172 * fVar204) ^
                                                 uVar153);
                                fVar156 = (float)((uint)(fVar158 * fVar185 +
                                                        fVar163 * fVar194 + fVar177 * fVar206) ^
                                                 uVar176);
                                local_1b48._4_4_ = fVar156;
                                local_1b48._0_4_ = fVar136;
                                fVar163 = (float)((uint)(fVar158 * fVar186 +
                                                        fVar166 * fVar196 + fVar179 * fVar208) ^
                                                 uVar178);
                                fVar166 = (float)((uint)(fVar158 * fVar187 +
                                                        fVar102 * fVar198 + fVar181 * fVar210) ^
                                                 uVar180);
                                local_1ba8._0_4_ = local_1a48._0_4_;
                                local_1ba8._4_4_ = local_1a48._4_4_;
                                local_1ba8._8_4_ = local_1a48._8_4_;
                                local_1ba8._12_4_ = local_1a48._12_4_;
                                auVar83._0_4_ = -(uint)(0.0 <= fVar136) & local_1ba8._0_4_;
                                auVar83._4_4_ = -(uint)(0.0 <= fVar156) & local_1ba8._4_4_;
                                auVar83._8_4_ = -(uint)(0.0 <= fVar163) & local_1ba8._8_4_;
                                auVar83._12_4_ = -(uint)(0.0 <= fVar166) & local_1ba8._12_4_;
                                iVar32 = movmskps((int)uVar34,auVar83);
                                fVar78 = pfVar50[-4];
                                fVar97 = pfVar50[-3];
                                fVar100 = pfVar50[-2];
                                auVar72 = auVar92;
                                _local_1b68 = local_1b58;
                                local_1b48 = _local_1b78;
                                fVar101 = local_1b98;
                                fVar103 = fStack_1b94;
                                fVar116 = fStack_1b90;
                                fVar118 = fStack_1b8c;
                                if (iVar32 == 0) {
LAB_0025b382:
                                  auVar72 = auVar92;
                                  _local_1b68 = local_1b58;
                                  local_1b48 = _local_1b78;
                                  fVar101 = local_1b98;
                                  fVar103 = fStack_1b94;
                                  fVar116 = fStack_1b90;
                                  fVar118 = fStack_1b8c;
                                  fVar179 = local_1b18;
                                  fVar181 = fStack_1b14;
                                  fVar183 = fStack_1b10;
                                  fVar184 = fStack_1b0c;
                                  fVar137 = local_1b38;
                                  fVar142 = fStack_1b34;
                                  fVar144 = fStack_1b30;
                                  fVar146 = fStack_1b2c;
                                }
                                else {
                                  fVar102 = (float)((uint)(fVar183 * fVar184 +
                                                          fVar211 * fVar190 + fVar189 * fVar204) ^
                                                   uVar153);
                                  fVar158 = (float)((uint)(fVar183 * fVar185 +
                                                          fVar214 * fVar194 + fVar193 * fVar206) ^
                                                   uVar176);
                                  fVar172 = (float)((uint)(fVar183 * fVar186 +
                                                          fVar217 * fVar196 + fVar195 * fVar208) ^
                                                   uVar178);
                                  fVar177 = (float)((uint)(fVar183 * fVar187 +
                                                          fVar220 * fVar198 + fVar197 * fVar210) ^
                                                   uVar180);
                                  auVar151._0_4_ = -(uint)(0.0 <= fVar102) & auVar83._0_4_;
                                  auVar151._4_4_ = -(uint)(0.0 <= fVar158) & auVar83._4_4_;
                                  auVar151._8_4_ = -(uint)(0.0 <= fVar172) & auVar83._8_4_;
                                  auVar151._12_4_ = -(uint)(0.0 <= fVar177) & auVar83._12_4_;
                                  iVar32 = movmskps(iVar32,auVar151);
                                  if (iVar32 == 0) {
                                    iVar32 = 0;
                                    fVar179 = local_1b18;
                                    fVar181 = fStack_1b14;
                                    fVar183 = fStack_1b10;
                                    fVar184 = fStack_1b0c;
                                    fVar137 = local_1b38;
                                    fVar142 = fStack_1b34;
                                    fVar144 = fStack_1b30;
                                    fVar146 = fStack_1b2c;
                                  }
                                  else {
                                    fVar179 = ABS(fVar121);
                                    fVar181 = ABS(fVar131);
                                    fVar183 = ABS(fVar134);
                                    fVar184 = ABS(fVar120);
                                    auVar199._0_4_ =
                                         -(uint)(fVar102 <= fVar179 - fVar136) & auVar151._0_4_;
                                    auVar199._4_4_ =
                                         -(uint)(fVar158 <= fVar181 - fVar156) & auVar151._4_4_;
                                    auVar199._8_4_ =
                                         -(uint)(fVar172 <= fVar183 - fVar163) & auVar151._8_4_;
                                    auVar199._12_4_ =
                                         -(uint)(fVar177 <= fVar184 - fVar166) & auVar151._12_4_;
                                    iVar32 = movmskps(iVar32,auVar199);
                                    if (iVar32 == 0) {
                                      iVar32 = 0;
                                      fVar179 = local_1b18;
                                      fVar181 = fStack_1b14;
                                      fVar183 = fStack_1b10;
                                      fVar184 = fStack_1b0c;
                                      fVar137 = local_1b38;
                                      fVar142 = fStack_1b34;
                                      fVar144 = fStack_1b30;
                                      fVar146 = fStack_1b2c;
                                    }
                                    else {
                                      fVar101 = (float)(uVar153 ^
                                                       (uint)(fVar203 * fVar137 +
                                                             fVar104 * fVar138 + fVar122 * fVar212))
                                      ;
                                      fVar103 = (float)(uVar176 ^
                                                       (uint)(fVar205 * fVar142 +
                                                             fVar117 * fVar143 + fVar132 * fVar215))
                                      ;
                                      fVar116 = (float)(uVar178 ^
                                                       (uint)(fVar207 * fVar144 +
                                                             fVar119 * fVar145 + fVar135 * fVar218))
                                      ;
                                      fVar118 = (float)(uVar180 ^
                                                       (uint)(fVar155 * fVar146 +
                                                             fVar162 * fVar147 + fVar165 * fVar221))
                                      ;
                                      auVar91._0_4_ =
                                           -(uint)(fVar101 <= *(float *)(ray + 0x80) * fVar179 &&
                                                  *(float *)(ray + 0x30) * fVar179 < fVar101) &
                                           auVar199._0_4_;
                                      auVar91._4_4_ =
                                           -(uint)(fVar103 <= *(float *)(ray + 0x84) * fVar181 &&
                                                  *(float *)(ray + 0x34) * fVar181 < fVar103) &
                                           auVar199._4_4_;
                                      auVar91._8_4_ =
                                           -(uint)(fVar116 <= *(float *)(ray + 0x88) * fVar183 &&
                                                  *(float *)(ray + 0x38) * fVar183 < fVar116) &
                                           auVar199._8_4_;
                                      auVar91._12_4_ =
                                           -(uint)(fVar118 <= *(float *)(ray + 0x8c) * fVar184 &&
                                                  *(float *)(ray + 0x3c) * fVar184 < fVar118) &
                                           auVar199._12_4_;
                                      iVar32 = movmskps(iVar32,auVar91);
                                      if (iVar32 == 0) {
                                        iVar32 = 0;
                                        fVar101 = local_1b98;
                                        fVar103 = fStack_1b94;
                                        fVar116 = fStack_1b90;
                                        fVar118 = fStack_1b8c;
                                        fVar179 = local_1b18;
                                        fVar181 = fStack_1b14;
                                        fVar183 = fStack_1b10;
                                        fVar184 = fStack_1b0c;
                                        fVar137 = local_1b38;
                                        fVar142 = fStack_1b34;
                                        fVar144 = fStack_1b30;
                                        fVar146 = fStack_1b2c;
                                      }
                                      else {
                                        auVar72._0_4_ = -(uint)(fVar121 != 0.0) & auVar91._0_4_;
                                        auVar72._4_4_ = -(uint)(fVar131 != 0.0) & auVar91._4_4_;
                                        auVar72._8_4_ = -(uint)(fVar134 != 0.0) & auVar91._8_4_;
                                        auVar72._12_4_ = -(uint)(fVar120 != 0.0) & auVar91._12_4_;
                                        iVar32 = movmskps(iVar32,auVar72);
                                        local_1b68._4_4_ = fVar158;
                                        local_1b68._0_4_ = fVar102;
                                        fStack_1b60 = fVar172;
                                        fStack_1b5c = fVar177;
                                        local_1b48._8_4_ = fVar163;
                                        local_1b48._12_4_ = fVar166;
                                        if (iVar32 == 0) goto LAB_0025b382;
                                      }
                                    }
                                  }
                                }
                                auVar84._4_4_ = fVar97;
                                auVar84._0_4_ = fVar97;
                                auVar84._8_4_ = fVar97;
                                auVar84._12_4_ = fVar97;
                                iVar32 = movmskps(iVar32,auVar72);
                                auVar85._4_12_ = auVar84._4_12_;
                                local_1ba8 = local_1a48;
                                if (iVar32 == 0) {
                                  uVar153 = 0;
                                }
                                else {
                                  auVar85._0_4_ =
                                       (float)(int)(*(ushort *)
                                                     ((long)&((Intersectors *)valid_i)->
                                                             leafIntersector + lVar11) - 1);
                                  auVar106._4_4_ = fVar97;
                                  auVar106._0_4_ = auVar85._0_4_;
                                  auVar106._8_4_ = fVar97;
                                  auVar106._12_4_ = fVar97;
                                  auVar81 = rcpss(auVar106,auVar85);
                                  fVar162 = (2.0 - auVar85._0_4_ * auVar81._0_4_) * auVar81._0_4_;
                                  auVar86._0_4_ =
                                       (float)(int)(*(ushort *)
                                                     ((long)&((Intersectors *)valid_i)->
                                                             leafIntersector + lVar11 + 2) - 1);
                                  auVar86._4_12_ = auVar85._4_12_;
                                  auVar107._4_4_ = fVar97;
                                  auVar107._0_4_ = auVar86._0_4_;
                                  auVar107._8_4_ = fVar97;
                                  auVar107._12_4_ = fVar97;
                                  auVar81 = rcpss(auVar107,auVar86);
                                  fVar155 = (float)(((uint)uVar41 & 1) + uVar154);
                                  auVar125._0_4_ = fVar162 * (fVar155 * fVar179 + local_1b48._0_4_);
                                  auVar125._4_4_ = fVar162 * (fVar155 * fVar181 + local_1b48._4_4_);
                                  auVar125._8_4_ = fVar162 * (fVar155 * fVar183 + local_1b48._8_4_);
                                  auVar125._12_4_ =
                                       fVar162 * (fVar155 * fVar184 + local_1b48._12_4_);
                                  local_1b48 = blendvps(local_1b48,auVar125,auVar72);
                                  fVar162 = (2.0 - auVar86._0_4_ * auVar81._0_4_) * auVar81._0_4_;
                                  fVar155 = (float)(int)(((uint)(uVar41 >> 1) & 0x7fffffff) +
                                                        uVar171);
                                  auVar139._0_4_ = fVar162 * (fVar155 * fVar179 + local_1b68._0_4_);
                                  auVar139._4_4_ = fVar162 * (fVar155 * fVar181 + local_1b68._4_4_);
                                  auVar139._8_4_ = fVar162 * (fVar155 * fVar183 + local_1b68._8_4_);
                                  auVar139._12_4_ =
                                       fVar162 * (fVar155 * fVar184 + local_1b68._12_4_);
                                  _local_1b68 = blendvps(_local_1b68,auVar139,auVar72);
                                  uVar153 = lower_z.field_0.i[uVar41];
                                  pRVar14 = (context->scene->geometries).items;
                                  pGVar10 = pRVar14[uVar153].ptr;
                                  uVar176 = pGVar10->mask;
                                  auVar87._0_4_ = -(uint)((uVar176 & *(uint *)(ray + 0x90)) == 0);
                                  auVar87._4_4_ = -(uint)((uVar176 & *(uint *)(ray + 0x94)) == 0);
                                  auVar87._8_4_ = -(uint)((uVar176 & *(uint *)(ray + 0x98)) == 0);
                                  auVar87._12_4_ = -(uint)((uVar176 & *(uint *)(ray + 0x9c)) == 0);
                                  aVar88 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                           (~auVar87 & auVar72);
                                  uVar176 = movmskps((int)pRVar14,(undefined1  [16])aVar88);
                                  pRVar39 = (RTCIntersectArguments *)(ulong)uVar176;
                                  if (uVar176 != 0) {
                                    pRVar39 = (RTCIntersectArguments *)
                                              (ulong)(uint)upper_z.field_0.i[uVar41];
                                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                       (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                      auVar28._4_4_ = fVar181;
                                      auVar28._0_4_ = fVar179;
                                      auVar28._8_4_ = fVar183;
                                      auVar28._12_4_ = fVar184;
                                      auVar81 = rcpps(auVar72,auVar28);
                                      fVar155 = auVar81._0_4_;
                                      fVar162 = auVar81._4_4_;
                                      fVar165 = auVar81._8_4_;
                                      fVar120 = auVar81._12_4_;
                                      upper_x.field_0.v[0] = fVar137;
                                      upper_x.field_0.v[1] = fVar142;
                                      upper_x.field_0.v[2] = fVar144;
                                      upper_x.field_0.v[3] = fVar146;
                                      auVar108._0_4_ =
                                           ((1.0 - fVar179 * fVar155) * fVar155 + fVar155) * fVar101
                                      ;
                                      auVar108._4_4_ =
                                           ((1.0 - fVar181 * fVar162) * fVar162 + fVar162) * fVar103
                                      ;
                                      auVar108._8_4_ =
                                           ((1.0 - fVar183 * fVar165) * fVar165 + fVar165) * fVar116
                                      ;
                                      auVar108._12_4_ =
                                           ((1.0 - fVar184 * fVar120) * fVar120 + fVar120) * fVar118
                                      ;
                                      auVar81 = *(undefined1 (*) [16])(ray + 0x80);
                                      auVar129 = blendvps(auVar81,auVar108,(undefined1  [16])aVar88)
                                      ;
                                      *(undefined1 (*) [16])(ray + 0x80) = auVar129;
                                      upper_y.field_0 = aVar88;
                                      lower_y.field_0._0_8_ = &upper_y;
                                      lower_y.field_0._8_8_ = pGVar10->userPtr;
                                      pRVar35 = (RayK<4> *)pGVar10->occlusionFilterN;
                                      if (pRVar35 != (RayK<4> *)0x0) {
                                        pRVar35 = (RayK<4> *)(*(code *)pRVar35)(&lower_y);
                                      }
                                      if (upper_y.field_0 ==
                                          (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0) {
                                        auVar109._8_4_ = 0xffffffff;
                                        auVar109._0_8_ = 0xffffffffffffffff;
                                        auVar109._12_4_ = 0xffffffff;
                                        auVar109 = auVar109 ^ _DAT_01febe20;
                                      }
                                      else {
                                        pRVar39 = context->args;
                                        if ((pRVar39->filter != (RTCFilterFunctionN)0x0) &&
                                           (((pRVar39->flags &
                                             RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                            (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                                          (*pRVar39->filter)((RTCFilterFunctionNArguments *)&lower_y
                                                            );
                                        }
                                        auVar69._0_4_ = -(uint)(upper_y.field_0.i[0] == 0);
                                        auVar69._4_4_ = -(uint)(upper_y.field_0.i[1] == 0);
                                        auVar69._8_4_ = -(uint)(upper_y.field_0.i[2] == 0);
                                        auVar69._12_4_ = -(uint)(upper_y.field_0.i[3] == 0);
                                        auVar109 = auVar69 ^ _DAT_01febe20;
                                        auVar129 = blendvps(_DAT_01feba00,
                                                            *(undefined1 (*) [16])(ray + 0x80),
                                                            auVar69);
                                        *(undefined1 (*) [16])(ray + 0x80) = auVar129;
                                        pRVar35 = ray;
                                      }
                                      uVar153 = (uint)pRVar35;
                                      auVar113._0_4_ = auVar109._0_4_ << 0x1f;
                                      auVar113._4_4_ = auVar109._4_4_ << 0x1f;
                                      auVar113._8_4_ = auVar109._8_4_ << 0x1f;
                                      auVar113._12_4_ = auVar109._12_4_ << 0x1f;
                                      aVar88._0_4_ = auVar113._0_4_ >> 0x1f;
                                      aVar88._4_4_ = auVar113._4_4_ >> 0x1f;
                                      aVar88._8_4_ = auVar113._8_4_ >> 0x1f;
                                      aVar88._12_4_ = auVar113._12_4_ >> 0x1f;
                                      auVar81 = blendvps(auVar81,*(undefined1 (*) [16])(ray + 0x80),
                                                         auVar113);
                                      *(undefined1 (*) [16])(ray + 0x80) = auVar81;
                                    }
                                    local_1ba8 = ~(undefined1  [16])aVar88 & local_1a48;
                                  }
                                }
                                fVar143 = fVar78 - fVar74;
                                fVar145 = fVar78 - fVar74;
                                fVar147 = fVar78 - fVar74;
                                fVar74 = fVar78 - fVar74;
                                fVar158 = fVar97 - fVar76;
                                fVar177 = fVar97 - fVar76;
                                fVar186 = fVar97 - fVar76;
                                fVar76 = fVar97 - fVar76;
                                fVar132 = fVar100 - fVar75;
                                fVar135 = fVar100 - fVar75;
                                fVar138 = fVar100 - fVar75;
                                fVar75 = fVar100 - fVar75;
                                fVar190 = fVar168 - fVar78;
                                fVar194 = fVar168 - fVar78;
                                fVar196 = fVar168 - fVar78;
                                fVar168 = fVar168 - fVar78;
                                fVar206 = fVar169 - fVar97;
                                fVar207 = fVar169 - fVar97;
                                fVar208 = fVar169 - fVar97;
                                fVar169 = fVar169 - fVar97;
                                fVar210 = fVar54 - fVar100;
                                fVar211 = fVar54 - fVar100;
                                fVar212 = fVar54 - fVar100;
                                fVar54 = fVar54 - fVar100;
                                local_1b38 = fVar206 * fVar132 - fVar210 * fVar158;
                                fStack_1b34 = fVar207 * fVar135 - fVar211 * fVar177;
                                fStack_1b30 = fVar208 * fVar138 - fVar212 * fVar186;
                                fStack_1b2c = fVar169 * fVar75 - fVar54 * fVar76;
                                fVar104 = fVar210 * fVar143 - fVar190 * fVar132;
                                fVar117 = fVar211 * fVar145 - fVar194 * fVar135;
                                fVar119 = fVar212 * fVar147 - fVar196 * fVar138;
                                fVar122 = fVar54 * fVar74 - fVar168 * fVar75;
                                fVar213 = fVar78 - *(float *)ray;
                                fVar216 = fVar78 - *(float *)(ray + 4);
                                fVar219 = fVar78 - *(float *)(ray + 8);
                                fVar78 = fVar78 - *(float *)(ray + 0xc);
                                fVar203 = fVar97 - *(float *)(ray + 0x10);
                                fVar204 = fVar97 - *(float *)(ray + 0x14);
                                fVar205 = fVar97 - *(float *)(ray + 0x18);
                                fVar97 = fVar97 - *(float *)(ray + 0x1c);
                                fVar214 = fVar190 * fVar158 - fVar206 * fVar143;
                                fVar215 = fVar194 * fVar177 - fVar207 * fVar145;
                                fVar217 = fVar196 * fVar186 - fVar208 * fVar147;
                                fVar218 = fVar168 * fVar76 - fVar169 * fVar74;
                                fVar220 = fVar100 - *(float *)(ray + 0x20);
                                fVar221 = fVar100 - *(float *)(ray + 0x24);
                                fVar209 = fVar100 - *(float *)(ray + 0x28);
                                fVar100 = fVar100 - *(float *)(ray + 0x2c);
                                fVar155 = *(float *)(ray + 0x40);
                                fVar162 = *(float *)(ray + 0x44);
                                fVar165 = *(float *)(ray + 0x48);
                                fVar120 = *(float *)(ray + 0x4c);
                                fVar121 = *(float *)(ray + 0x50);
                                fVar131 = *(float *)(ray + 0x54);
                                fVar134 = *(float *)(ray + 0x58);
                                fVar136 = *(float *)(ray + 0x5c);
                                fVar156 = *(float *)(ray + 0x60);
                                fVar163 = *(float *)(ray + 100);
                                fVar166 = *(float *)(ray + 0x68);
                                fVar102 = *(float *)(ray + 0x6c);
                                auVar126._0_4_ = fVar203 * fVar156 - fVar220 * fVar121;
                                auVar126._4_4_ = fVar204 * fVar163 - fVar221 * fVar131;
                                auVar126._8_4_ = fVar205 * fVar166 - fVar209 * fVar134;
                                auVar126._12_4_ = fVar97 * fVar102 - fVar100 * fVar136;
                                auVar133 = auVar126._4_12_;
                                fVar172 = fVar220 * fVar155 - fVar213 * fVar156;
                                fVar185 = fVar221 * fVar162 - fVar216 * fVar163;
                                fVar187 = fVar209 * fVar165 - fVar219 * fVar166;
                                fVar189 = fVar100 * fVar120 - fVar78 * fVar102;
                                fVar193 = fVar213 * fVar121 - fVar203 * fVar155;
                                fVar195 = fVar216 * fVar131 - fVar204 * fVar162;
                                fVar197 = fVar219 * fVar134 - fVar205 * fVar165;
                                fVar198 = fVar78 * fVar136 - fVar97 * fVar120;
                                fVar155 = fVar155 * local_1b38 +
                                          fVar121 * fVar104 + fVar156 * fVar214;
                                fVar162 = fVar162 * fStack_1b34 +
                                          fVar131 * fVar117 + fVar163 * fVar215;
                                fVar165 = fVar165 * fStack_1b30 +
                                          fVar134 * fVar119 + fVar166 * fVar217;
                                fVar120 = fVar120 * fStack_1b2c +
                                          fVar136 * fVar122 + fVar102 * fVar218;
                                uVar176 = (uint)fVar155 & 0x80000000;
                                uVar178 = (uint)fVar162 & 0x80000000;
                                uVar180 = (uint)fVar165 & 0x80000000;
                                uVar182 = (uint)fVar120 & 0x80000000;
                                local_1b78._0_4_ =
                                     (uint)(fVar190 * auVar126._0_4_ +
                                           fVar206 * fVar172 + fVar210 * fVar193) ^ uVar176;
                                local_1b78._4_4_ =
                                     (uint)(fVar194 * auVar126._4_4_ +
                                           fVar207 * fVar185 + fVar211 * fVar195) ^ uVar178;
                                fStack_1b70 = (float)((uint)(fVar196 * auVar126._8_4_ +
                                                            fVar208 * fVar187 + fVar212 * fVar197) ^
                                                     uVar180);
                                fStack_1b6c = (float)((uint)(fVar168 * auVar126._12_4_ +
                                                            fVar169 * fVar189 + fVar54 * fVar198) ^
                                                     uVar182);
                                auVar159._0_4_ =
                                     -(uint)(0.0 <= (float)local_1b78._0_4_) & local_1ba8._0_4_;
                                auVar159._4_4_ =
                                     -(uint)(0.0 <= (float)local_1b78._4_4_) & local_1ba8._4_4_;
                                auVar159._8_4_ = -(uint)(0.0 <= fStack_1b70) & local_1ba8._8_4_;
                                auVar159._12_4_ = -(uint)(0.0 <= fStack_1b6c) & local_1ba8._12_4_;
                                iVar32 = movmskps(uVar153,auVar159);
                                if (iVar32 == 0) {
LAB_0025b6c7:
                                  iVar32 = 0;
                                  auVar71 = auVar92;
                                  local_1b58 = _local_1b68;
                                  _local_1b78 = local_1b48;
                                  local_1b18 = fVar179;
                                  fStack_1b14 = fVar181;
                                  fStack_1b10 = fVar183;
                                  fStack_1b0c = fVar184;
                                  local_1b38 = fVar137;
                                  fStack_1b34 = fVar142;
                                  fStack_1b30 = fVar144;
                                  fStack_1b2c = fVar146;
                                  local_1b98 = fVar101;
                                  fStack_1b94 = fVar103;
                                  fStack_1b90 = fVar116;
                                  fStack_1b8c = fVar118;
                                }
                                else {
                                  local_1b58._0_4_ =
                                       (float)((uint)(fVar143 * auVar126._0_4_ +
                                                     fVar158 * fVar172 + fVar132 * fVar193) ^
                                              uVar176);
                                  local_1b58._4_4_ =
                                       (float)((uint)(fVar145 * auVar126._4_4_ +
                                                     fVar177 * fVar185 + fVar135 * fVar195) ^
                                              uVar178);
                                  local_1b58._8_4_ =
                                       (float)((uint)(fVar147 * auVar126._8_4_ +
                                                     fVar186 * fVar187 + fVar138 * fVar197) ^
                                              uVar180);
                                  local_1b58._12_4_ =
                                       (float)((uint)(fVar74 * auVar126._12_4_ +
                                                     fVar76 * fVar189 + fVar75 * fVar198) ^ uVar182)
                                  ;
                                  auVar112._0_4_ = -(uint)(0.0 <= local_1b58._0_4_) & auVar159._0_4_
                                  ;
                                  auVar112._4_4_ = -(uint)(0.0 <= local_1b58._4_4_) & auVar159._4_4_
                                  ;
                                  auVar112._8_4_ = -(uint)(0.0 <= local_1b58._8_4_) & auVar159._8_4_
                                  ;
                                  auVar112._12_4_ =
                                       -(uint)(0.0 <= local_1b58._12_4_) & auVar159._12_4_;
                                  iVar32 = movmskps(iVar32,auVar112);
                                  if (iVar32 != 0) {
                                    auVar130._8_4_ = uVar180;
                                    auVar130._0_8_ = CONCAT44(fVar162,fVar155) & 0x8000000080000000;
                                    auVar130._12_4_ = uVar182;
                                    auVar133 = auVar130._4_12_;
                                    local_1b18 = ABS(fVar155);
                                    fStack_1b14 = ABS(fVar162);
                                    fStack_1b10 = ABS(fVar165);
                                    fStack_1b0c = ABS(fVar120);
                                    uVar153 = -(uint)(local_1b58._0_4_ <=
                                                     local_1b18 - (float)local_1b78._0_4_) &
                                              auVar112._0_4_;
                                    uVar200 = -(uint)(local_1b58._4_4_ <=
                                                     fStack_1b14 - (float)local_1b78._4_4_) &
                                              auVar112._4_4_;
                                    uVar201 = -(uint)(local_1b58._8_4_ <= fStack_1b10 - fStack_1b70)
                                              & auVar112._8_4_;
                                    uVar202 = -(uint)(local_1b58._12_4_ <= fStack_1b0c - fStack_1b6c
                                                     ) & auVar112._12_4_;
                                    auVar27._4_4_ = uVar200;
                                    auVar27._0_4_ = uVar153;
                                    auVar27._8_4_ = uVar201;
                                    auVar27._12_4_ = uVar202;
                                    iVar32 = movmskps(iVar32,auVar27);
                                    if (iVar32 != 0) {
                                      local_1b98 = (float)(uVar176 ^
                                                          (uint)(fVar213 * local_1b38 +
                                                                fVar203 * fVar104 +
                                                                fVar220 * fVar214));
                                      fStack_1b94 = (float)(uVar178 ^
                                                           (uint)(fVar216 * fStack_1b34 +
                                                                 fVar204 * fVar117 +
                                                                 fVar221 * fVar215));
                                      fStack_1b90 = (float)(uVar180 ^
                                                           (uint)(fVar219 * fStack_1b30 +
                                                                 fVar205 * fVar119 +
                                                                 fVar209 * fVar217));
                                      fStack_1b8c = (float)(uVar182 ^
                                                           (uint)(fVar78 * fStack_1b2c +
                                                                 fVar97 * fVar122 +
                                                                 fVar100 * fVar218));
                                      bVar53 = *(float *)(ray + 0x34) * fStack_1b14 < fStack_1b94;
                                      bVar16 = *(float *)(ray + 0x38) * fStack_1b10 < fStack_1b90;
                                      bVar17 = *(float *)(ray + 0x3c) * fStack_1b0c < fStack_1b8c;
                                      auVar133._4_4_ = -(uint)bVar16;
                                      auVar133._0_4_ = -(uint)bVar53;
                                      auVar133._8_4_ = -(uint)bVar17;
                                      auVar115._0_4_ =
                                           -(uint)(local_1b98 <= *(float *)(ray + 0x80) * local_1b18
                                                  && *(float *)(ray + 0x30) * local_1b18 <
                                                     local_1b98) & uVar153;
                                      auVar115._4_4_ =
                                           -(uint)(fStack_1b94 <=
                                                   *(float *)(ray + 0x84) * fStack_1b14 && bVar53) &
                                           uVar200;
                                      auVar115._8_4_ =
                                           -(uint)(fStack_1b90 <=
                                                   *(float *)(ray + 0x88) * fStack_1b10 && bVar16) &
                                           uVar201;
                                      auVar115._12_4_ =
                                           -(uint)(fStack_1b8c <=
                                                   *(float *)(ray + 0x8c) * fStack_1b0c && bVar17) &
                                           uVar202;
                                      iVar32 = movmskps(iVar32,auVar115);
                                      if (iVar32 == 0) goto LAB_0025b6c7;
                                      auVar71._0_4_ = -(uint)(fVar155 != 0.0) & auVar115._0_4_;
                                      auVar71._4_4_ = -(uint)(fVar162 != 0.0) & auVar115._4_4_;
                                      auVar71._8_4_ = -(uint)(fVar165 != 0.0) & auVar115._8_4_;
                                      auVar71._12_4_ = -(uint)(fVar120 != 0.0) & auVar115._12_4_;
                                      iVar32 = movmskps(iVar32,auVar71);
                                      if (iVar32 != 0) goto LAB_0025b6cf;
                                    }
                                  }
                                  auVar71 = auVar92;
                                  local_1b58 = _local_1b68;
                                  _local_1b78 = local_1b48;
                                  local_1b18 = fVar179;
                                  fStack_1b14 = fVar181;
                                  fStack_1b10 = fVar183;
                                  fStack_1b0c = fVar184;
                                  local_1b38 = fVar137;
                                  fStack_1b34 = fVar142;
                                  fStack_1b30 = fVar144;
                                  fStack_1b2c = fVar146;
                                  local_1b98 = fVar101;
                                  fStack_1b94 = fVar103;
                                  fStack_1b90 = fVar116;
                                  fStack_1b8c = fVar118;
                                }
LAB_0025b6cf:
                                uVar153 = movmskps(iVar32,auVar71);
                                if (uVar153 != 0) {
                                  fVar169 = local_1b18 - local_1b78._0_4_;
                                  fVar54 = fStack_1b14 - local_1b78._4_4_;
                                  auVar175._4_4_ = fVar54;
                                  auVar175._0_4_ = fVar169;
                                  fVar74 = fStack_1b10 - local_1b78._8_4_;
                                  fVar76 = fStack_1b0c - local_1b78._12_4_;
                                  fVar155 = local_1b18 - local_1b58._0_4_;
                                  fVar162 = fStack_1b14 - local_1b58._4_4_;
                                  auVar161._4_4_ = fVar162;
                                  auVar161._0_4_ = fVar155;
                                  fVar165 = fStack_1b10 - local_1b58._8_4_;
                                  fVar168 = fStack_1b0c - local_1b58._12_4_;
                                  auVar127._0_4_ =
                                       (float)(int)(*(ushort *)
                                                     ((long)&((Intersectors *)valid_i)->
                                                             leafIntersector + lVar11) - 1);
                                  auVar127._4_12_ = auVar133;
                                  auVar140._4_4_ = auVar133._0_4_;
                                  auVar140._0_4_ = auVar127._0_4_;
                                  auVar140._8_4_ = auVar133._4_4_;
                                  auVar140._12_4_ = auVar133._8_4_;
                                  auVar81 = rcpss(auVar140,auVar127);
                                  auVar160._4_12_ = local_1b58._4_12_;
                                  auVar160._0_4_ =
                                       (float)(int)(*(ushort *)
                                                     ((long)&((Intersectors *)valid_i)->
                                                             leafIntersector + lVar11 + 2) - 1);
                                  fVar97 = (2.0 - auVar127._0_4_ * auVar81._0_4_) * auVar81._0_4_;
                                  auVar141._4_4_ = local_1b58._4_4_;
                                  auVar141._0_4_ = auVar160._0_4_;
                                  auVar141._8_4_ = local_1b58._8_4_;
                                  auVar141._12_4_ = local_1b58._12_4_;
                                  auVar81 = rcpss(auVar141,auVar160);
                                  fVar75 = (2.0 - auVar160._0_4_ * auVar81._0_4_) * auVar81._0_4_;
                                  fVar78 = (float)(((uint)uVar41 & 1) + uVar154);
                                  auVar150._0_4_ = fVar97 * (fVar78 * local_1b18 + fVar169);
                                  auVar150._4_4_ = fVar97 * (fVar78 * fStack_1b14 + fVar54);
                                  auVar150._8_4_ = fVar97 * (fVar78 * fStack_1b10 + fVar74);
                                  auVar150._12_4_ = fVar97 * (fVar78 * fStack_1b0c + fVar76);
                                  auVar175._8_4_ = fVar74;
                                  auVar175._12_4_ = fVar76;
                                  _local_1b78 = blendvps(auVar175,auVar150,auVar71);
                                  fVar169 = (float)(int)(((uint)(uVar41 >> 1) & 0x7fffffff) +
                                                        uVar171);
                                  auVar128._0_4_ = fVar75 * (fVar169 * local_1b18 + fVar155);
                                  auVar128._4_4_ = fVar75 * (fVar169 * fStack_1b14 + fVar162);
                                  auVar128._8_4_ = fVar75 * (fVar169 * fStack_1b10 + fVar165);
                                  auVar128._12_4_ = fVar75 * (fVar169 * fStack_1b0c + fVar168);
                                  auVar161._8_4_ = fVar165;
                                  auVar161._12_4_ = fVar168;
                                  local_1b58 = blendvps(auVar161,auVar128,auVar71);
                                  uVar153 = lower_z.field_0.i[uVar41];
                                  pRVar14 = (context->scene->geometries).items;
                                  pGVar10 = pRVar14[uVar153].ptr;
                                  uVar176 = pGVar10->mask;
                                  auVar89._0_4_ = -(uint)((uVar176 & *(uint *)(ray + 0x90)) == 0);
                                  auVar89._4_4_ = -(uint)((uVar176 & *(uint *)(ray + 0x94)) == 0);
                                  auVar89._8_4_ = -(uint)((uVar176 & *(uint *)(ray + 0x98)) == 0);
                                  auVar89._12_4_ = -(uint)((uVar176 & *(uint *)(ray + 0x9c)) == 0);
                                  aVar90 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                           (~auVar89 & auVar71);
                                  uVar176 = movmskps((int)pRVar14,(undefined1  [16])aVar90);
                                  pRVar39 = (RTCIntersectArguments *)(ulong)uVar176;
                                  if (uVar176 != 0) {
                                    pRVar39 = (RTCIntersectArguments *)
                                              (ulong)(uint)upper_z.field_0.i[uVar41];
                                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                       (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                      auVar26._4_4_ = fStack_1b14;
                                      auVar26._0_4_ = local_1b18;
                                      auVar26._8_4_ = fStack_1b10;
                                      auVar26._12_4_ = fStack_1b0c;
                                      auVar81 = rcpps(auVar71,auVar26);
                                      fVar155 = auVar81._0_4_;
                                      fVar162 = auVar81._4_4_;
                                      fVar165 = auVar81._8_4_;
                                      fVar168 = auVar81._12_4_;
                                      upper_x.field_0.v[0] = local_1b38;
                                      upper_x.field_0.v[1] = fStack_1b34;
                                      upper_x.field_0.v[2] = fStack_1b30;
                                      upper_x.field_0.v[3] = fStack_1b2c;
                                      auVar110._0_4_ =
                                           ((1.0 - local_1b18 * fVar155) * fVar155 + fVar155) *
                                           local_1b98;
                                      auVar110._4_4_ =
                                           ((1.0 - fStack_1b14 * fVar162) * fVar162 + fVar162) *
                                           fStack_1b94;
                                      auVar110._8_4_ =
                                           ((1.0 - fStack_1b10 * fVar165) * fVar165 + fVar165) *
                                           fStack_1b90;
                                      auVar110._12_4_ =
                                           ((1.0 - fStack_1b0c * fVar168) * fVar168 + fVar168) *
                                           fStack_1b8c;
                                      auVar81 = *(undefined1 (*) [16])(ray + 0x80);
                                      auVar129 = blendvps(auVar81,auVar110,(undefined1  [16])aVar90)
                                      ;
                                      *(undefined1 (*) [16])(ray + 0x80) = auVar129;
                                      upper_y.field_0 = aVar90;
                                      lower_y.field_0._0_8_ = &upper_y;
                                      lower_y.field_0._8_8_ = pGVar10->userPtr;
                                      pRVar35 = (RayK<4> *)pGVar10->occlusionFilterN;
                                      if (pRVar35 != (RayK<4> *)0x0) {
                                        pRVar35 = (RayK<4> *)(*(code *)pRVar35)(&lower_y);
                                      }
                                      if (upper_y.field_0 ==
                                          (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)0x0) {
                                        auVar111._8_4_ = 0xffffffff;
                                        auVar111._0_8_ = 0xffffffffffffffff;
                                        auVar111._12_4_ = 0xffffffff;
                                        auVar111 = auVar111 ^ _DAT_01febe20;
                                      }
                                      else {
                                        pRVar39 = context->args;
                                        if ((pRVar39->filter != (RTCFilterFunctionN)0x0) &&
                                           (((pRVar39->flags &
                                             RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                            (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                                          (*pRVar39->filter)((RTCFilterFunctionNArguments *)&lower_y
                                                            );
                                        }
                                        auVar70._0_4_ = -(uint)(upper_y.field_0.i[0] == 0);
                                        auVar70._4_4_ = -(uint)(upper_y.field_0.i[1] == 0);
                                        auVar70._8_4_ = -(uint)(upper_y.field_0.i[2] == 0);
                                        auVar70._12_4_ = -(uint)(upper_y.field_0.i[3] == 0);
                                        auVar111 = auVar70 ^ _DAT_01febe20;
                                        auVar129 = blendvps(_DAT_01feba00,
                                                            *(undefined1 (*) [16])(ray + 0x80),
                                                            auVar70);
                                        *(undefined1 (*) [16])(ray + 0x80) = auVar129;
                                        pRVar35 = ray;
                                      }
                                      uVar153 = (uint)pRVar35;
                                      auVar114._0_4_ = auVar111._0_4_ << 0x1f;
                                      auVar114._4_4_ = auVar111._4_4_ << 0x1f;
                                      auVar114._8_4_ = auVar111._8_4_ << 0x1f;
                                      auVar114._12_4_ = auVar111._12_4_ << 0x1f;
                                      aVar90._0_4_ = auVar114._0_4_ >> 0x1f;
                                      aVar90._4_4_ = auVar114._4_4_ >> 0x1f;
                                      aVar90._8_4_ = auVar114._8_4_ >> 0x1f;
                                      aVar90._12_4_ = auVar114._12_4_ >> 0x1f;
                                      auVar81 = blendvps(auVar81,*(undefined1 (*) [16])(ray + 0x80),
                                                         auVar114);
                                      *(undefined1 (*) [16])(ray + 0x80) = auVar81;
                                    }
                                    local_1ba8 = ~(undefined1  [16])aVar90 & local_1ba8;
                                  }
                                }
                                fVar168 = INFINITY;
                                fVar165 = INFINITY;
                                fVar162 = INFINITY;
                                fVar155 = INFINITY;
                                uVar153 = movmskps(uVar153,local_1ba8);
                                uVar34 = (ulong)uVar153;
                                if (uVar153 == 0) break;
                                uVar34 = uVar41 + 1;
                                pfVar50 = pfVar50 + 0x10;
                                bVar53 = uVar41 < 3;
                                uVar41 = uVar34;
                                local_1a48 = local_1ba8;
                              } while (bVar53);
                              local_1a48._0_4_ = uVar157 & local_1ba8._0_4_;
                              local_1a48._4_4_ = uVar164 & local_1ba8._4_4_;
                              local_1a48._8_4_ = uVar167 & local_1ba8._8_4_;
                              local_1a48._12_4_ = uVar170 & local_1ba8._12_4_;
                              iVar32 = movmskps((int)uVar34,local_1a48);
                              bVar53 = iVar32 == 0;
                            }
                          } while ((!bVar53) && (uVar45 = uVar45 & uVar45 - 1, uVar45 != 0));
                        }
                        lVar36 = lVar36 + 1;
                      } while (lVar36 != lVar33);
                      aVar73._0_8_ = local_1a48._0_8_ ^ 0xffffffffffffffff;
                      aVar73._8_4_ = local_1a48._8_4_ ^ 0xffffffff;
                      aVar73._12_4_ = local_1a48._12_4_ ^ 0xffffffff;
                    }
                    terminated.field_0 =
                         (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                         ((undefined1  [16])aVar73 | (undefined1  [16])terminated.field_0);
                    iVar32 = movmskps((int)lVar36,(undefined1  [16])terminated.field_0);
                    if (iVar32 == 0xf) goto LAB_0025c1e9;
                    tray.tfar.field_0 =
                         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01feba00,
                                  (undefined1  [16])terminated.field_0);
                    iVar32 = 0;
                    break;
                  }
                  goto LAB_0025c1fa;
                }
                uVar44 = 0;
                sVar43 = 8;
                local_1b68._0_4_ = fVar155;
                local_1b68._4_4_ = fVar162;
                fStack_1b60 = fVar165;
                fStack_1b5c = fVar168;
                do {
                  sVar9 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + uVar44 * 8);
                  if (sVar9 != 8) {
                    fVar169 = *(float *)(root.ptr + 0x20 + uVar44 * 4);
                    fVar54 = *(float *)(root.ptr + 0x30 + uVar44 * 4);
                    fVar74 = *(float *)(root.ptr + 0x40 + uVar44 * 4);
                    fVar76 = *(float *)(root.ptr + 0x50 + uVar44 * 4);
                    fVar103 = (fVar169 - (float)tray.org.field_0._0_4_) *
                              (float)tray.rdir.field_0._0_4_;
                    fVar116 = (fVar169 - (float)tray.org.field_0._4_4_) *
                              (float)tray.rdir.field_0._4_4_;
                    fVar118 = (fVar169 - (float)tray.org.field_0._8_4_) *
                              (float)tray.rdir.field_0._8_4_;
                    fVar120 = (fVar169 - (float)tray.org.field_0._12_4_) *
                              (float)tray.rdir.field_0._12_4_;
                    fVar121 = (fVar74 - (float)tray.org.field_0._16_4_) *
                              (float)tray.rdir.field_0._16_4_;
                    fVar131 = (fVar74 - (float)tray.org.field_0._20_4_) *
                              (float)tray.rdir.field_0._20_4_;
                    fVar134 = (fVar74 - (float)tray.org.field_0._24_4_) *
                              (float)tray.rdir.field_0._24_4_;
                    fVar136 = (fVar74 - (float)tray.org.field_0._28_4_) *
                              (float)tray.rdir.field_0._28_4_;
                    fVar169 = *(float *)(root.ptr + 0x60 + uVar44 * 4);
                    fVar137 = (fVar169 - (float)tray.org.field_0._32_4_) *
                              (float)tray.rdir.field_0._32_4_;
                    fVar142 = (fVar169 - (float)tray.org.field_0._36_4_) *
                              (float)tray.rdir.field_0._36_4_;
                    fVar144 = (fVar169 - (float)tray.org.field_0._40_4_) *
                              (float)tray.rdir.field_0._40_4_;
                    fVar146 = (fVar169 - (float)tray.org.field_0._44_4_) *
                              (float)tray.rdir.field_0._44_4_;
                    fVar78 = (fVar54 - (float)tray.org.field_0._0_4_) *
                             (float)tray.rdir.field_0._0_4_;
                    fVar97 = (fVar54 - (float)tray.org.field_0._4_4_) *
                             (float)tray.rdir.field_0._4_4_;
                    fVar100 = (fVar54 - (float)tray.org.field_0._8_4_) *
                              (float)tray.rdir.field_0._8_4_;
                    fVar101 = (fVar54 - (float)tray.org.field_0._12_4_) *
                              (float)tray.rdir.field_0._12_4_;
                    fVar54 = (fVar76 - (float)tray.org.field_0._16_4_) *
                             (float)tray.rdir.field_0._16_4_;
                    fVar74 = (fVar76 - (float)tray.org.field_0._20_4_) *
                             (float)tray.rdir.field_0._20_4_;
                    fVar75 = (fVar76 - (float)tray.org.field_0._24_4_) *
                             (float)tray.rdir.field_0._24_4_;
                    fVar76 = (fVar76 - (float)tray.org.field_0._28_4_) *
                             (float)tray.rdir.field_0._28_4_;
                    fVar169 = *(float *)(root.ptr + 0x70 + uVar44 * 4);
                    fVar156 = (fVar169 - (float)tray.org.field_0._32_4_) *
                              (float)tray.rdir.field_0._32_4_;
                    fVar163 = (fVar169 - (float)tray.org.field_0._36_4_) *
                              (float)tray.rdir.field_0._36_4_;
                    fVar166 = (fVar169 - (float)tray.org.field_0._40_4_) *
                              (float)tray.rdir.field_0._40_4_;
                    fVar169 = (fVar169 - (float)tray.org.field_0._44_4_) *
                              (float)tray.rdir.field_0._44_4_;
                    uVar31 = (uint)((int)fVar78 < (int)fVar103) * (int)fVar78 |
                             (uint)((int)fVar78 >= (int)fVar103) * (int)fVar103;
                    uVar152 = (uint)((int)fVar97 < (int)fVar116) * (int)fVar97 |
                              (uint)((int)fVar97 >= (int)fVar116) * (int)fVar116;
                    uVar153 = (uint)((int)fVar100 < (int)fVar118) * (int)fVar100 |
                              (uint)((int)fVar100 >= (int)fVar118) * (int)fVar118;
                    uVar154 = (uint)((int)fVar101 < (int)fVar120) * (int)fVar101 |
                              (uint)((int)fVar101 >= (int)fVar120) * (int)fVar120;
                    uVar171 = (uint)((int)fVar54 < (int)fVar121) * (int)fVar54 |
                              (uint)((int)fVar54 >= (int)fVar121) * (int)fVar121;
                    uVar176 = (uint)((int)fVar74 < (int)fVar131) * (int)fVar74 |
                              (uint)((int)fVar74 >= (int)fVar131) * (int)fVar131;
                    uVar178 = (uint)((int)fVar75 < (int)fVar134) * (int)fVar75 |
                              (uint)((int)fVar75 >= (int)fVar134) * (int)fVar134;
                    uVar180 = (uint)((int)fVar76 < (int)fVar136) * (int)fVar76 |
                              (uint)((int)fVar76 >= (int)fVar136) * (int)fVar136;
                    uVar171 = ((int)uVar171 < (int)uVar31) * uVar31 |
                              ((int)uVar171 >= (int)uVar31) * uVar171;
                    uVar176 = ((int)uVar176 < (int)uVar152) * uVar152 |
                              ((int)uVar176 >= (int)uVar152) * uVar176;
                    uVar178 = ((int)uVar178 < (int)uVar153) * uVar153 |
                              ((int)uVar178 >= (int)uVar153) * uVar178;
                    uVar180 = ((int)uVar180 < (int)uVar154) * uVar154 |
                              ((int)uVar180 >= (int)uVar154) * uVar180;
                    uVar31 = (uint)((int)fVar156 < (int)fVar137) * (int)fVar156 |
                             (uint)((int)fVar156 >= (int)fVar137) * (int)fVar137;
                    uVar152 = (uint)((int)fVar163 < (int)fVar142) * (int)fVar163 |
                              (uint)((int)fVar163 >= (int)fVar142) * (int)fVar142;
                    uVar153 = (uint)((int)fVar166 < (int)fVar144) * (int)fVar166 |
                              (uint)((int)fVar166 >= (int)fVar144) * (int)fVar144;
                    uVar154 = (uint)((int)fVar169 < (int)fVar146) * (int)fVar169 |
                              (uint)((int)fVar169 >= (int)fVar146) * (int)fVar146;
                    auVar149._0_4_ =
                         ((int)uVar31 < (int)uVar171) * uVar171 |
                         ((int)uVar31 >= (int)uVar171) * uVar31;
                    auVar149._4_4_ =
                         ((int)uVar152 < (int)uVar176) * uVar176 |
                         ((int)uVar152 >= (int)uVar176) * uVar152;
                    auVar149._8_4_ =
                         ((int)uVar153 < (int)uVar178) * uVar178 |
                         ((int)uVar153 >= (int)uVar178) * uVar153;
                    auVar149._12_4_ =
                         ((int)uVar154 < (int)uVar180) * uVar180 |
                         ((int)uVar154 >= (int)uVar180) * uVar154;
                    uVar171 = (uint)((int)fVar78 < (int)fVar103) * (int)fVar103 |
                              (uint)((int)fVar78 >= (int)fVar103) * (int)fVar78;
                    uVar176 = (uint)((int)fVar97 < (int)fVar116) * (int)fVar116 |
                              (uint)((int)fVar97 >= (int)fVar116) * (int)fVar97;
                    uVar178 = (uint)((int)fVar100 < (int)fVar118) * (int)fVar118 |
                              (uint)((int)fVar100 >= (int)fVar118) * (int)fVar100;
                    uVar180 = (uint)((int)fVar101 < (int)fVar120) * (int)fVar120 |
                              (uint)((int)fVar101 >= (int)fVar120) * (int)fVar101;
                    uVar31 = (uint)((int)fVar54 < (int)fVar121) * (int)fVar121 |
                             (uint)((int)fVar54 >= (int)fVar121) * (int)fVar54;
                    uVar152 = (uint)((int)fVar74 < (int)fVar131) * (int)fVar131 |
                              (uint)((int)fVar74 >= (int)fVar131) * (int)fVar74;
                    uVar153 = (uint)((int)fVar75 < (int)fVar134) * (int)fVar134 |
                              (uint)((int)fVar75 >= (int)fVar134) * (int)fVar75;
                    uVar154 = (uint)((int)fVar76 < (int)fVar136) * (int)fVar136 |
                              (uint)((int)fVar76 >= (int)fVar136) * (int)fVar76;
                    uVar31 = ((int)uVar171 < (int)uVar31) * uVar171 |
                             ((int)uVar171 >= (int)uVar31) * uVar31;
                    uVar152 = ((int)uVar176 < (int)uVar152) * uVar176 |
                              ((int)uVar176 >= (int)uVar152) * uVar152;
                    uVar153 = ((int)uVar178 < (int)uVar153) * uVar178 |
                              ((int)uVar178 >= (int)uVar153) * uVar153;
                    uVar154 = ((int)uVar180 < (int)uVar154) * uVar180 |
                              ((int)uVar180 >= (int)uVar154) * uVar154;
                    uVar171 = (uint)((int)fVar156 < (int)fVar137) * (int)fVar137 |
                              (uint)((int)fVar156 >= (int)fVar137) * (int)fVar156;
                    uVar176 = (uint)((int)fVar163 < (int)fVar142) * (int)fVar142 |
                              (uint)((int)fVar163 >= (int)fVar142) * (int)fVar163;
                    uVar178 = (uint)((int)fVar166 < (int)fVar144) * (int)fVar144 |
                              (uint)((int)fVar166 >= (int)fVar144) * (int)fVar166;
                    uVar180 = (uint)((int)fVar169 < (int)fVar146) * (int)fVar146 |
                              (uint)((int)fVar169 >= (int)fVar146) * (int)fVar169;
                    uVar31 = ((int)uVar31 < (int)uVar171) * uVar31 |
                             ((int)uVar31 >= (int)uVar171) * uVar171;
                    uVar152 = ((int)uVar152 < (int)uVar176) * uVar152 |
                              ((int)uVar152 >= (int)uVar176) * uVar176;
                    uVar153 = ((int)uVar153 < (int)uVar178) * uVar153 |
                              ((int)uVar153 >= (int)uVar178) * uVar178;
                    uVar154 = ((int)uVar154 < (int)uVar180) * uVar154 |
                              ((int)uVar154 >= (int)uVar180) * uVar180;
                    auVar58._4_4_ =
                         -(uint)((float)((tray.tnear.field_0.i[1] < (int)auVar149._4_4_) *
                                         auVar149._4_4_ |
                                        (uint)(tray.tnear.field_0.i[1] >= (int)auVar149._4_4_) *
                                        tray.tnear.field_0.i[1]) <=
                                (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar152) *
                                        tray.tfar.field_0.i[1] |
                                       (tray.tfar.field_0.i[1] >= (int)uVar152) * uVar152));
                    auVar58._0_4_ =
                         -(uint)((float)((tray.tnear.field_0.i[0] < (int)auVar149._0_4_) *
                                         auVar149._0_4_ |
                                        (uint)(tray.tnear.field_0.i[0] >= (int)auVar149._0_4_) *
                                        tray.tnear.field_0.i[0]) <=
                                (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar31) *
                                        tray.tfar.field_0.i[0] |
                                       (tray.tfar.field_0.i[0] >= (int)uVar31) * uVar31));
                    auVar58._8_4_ =
                         -(uint)((float)((tray.tnear.field_0.i[2] < (int)auVar149._8_4_) *
                                         auVar149._8_4_ |
                                        (uint)(tray.tnear.field_0.i[2] >= (int)auVar149._8_4_) *
                                        tray.tnear.field_0.i[2]) <=
                                (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar153) *
                                        tray.tfar.field_0.i[2] |
                                       (tray.tfar.field_0.i[2] >= (int)uVar153) * uVar153));
                    auVar58._12_4_ =
                         -(uint)((float)((tray.tnear.field_0.i[3] < (int)auVar149._12_4_) *
                                         auVar149._12_4_ |
                                        (uint)(tray.tnear.field_0.i[3] >= (int)auVar149._12_4_) *
                                        tray.tnear.field_0.i[3]) <=
                                (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar154) *
                                        tray.tfar.field_0.i[3] |
                                       (tray.tfar.field_0.i[3] >= (int)uVar154) * uVar154));
                    uVar31 = movmskps((int)valid_i,auVar58);
                    valid_i = (vint<4> *)(ulong)uVar31;
                    if (uVar31 != 0) {
                      auVar80._4_4_ = fVar162;
                      auVar80._0_4_ = fVar155;
                      auVar80._8_4_ = fVar165;
                      auVar80._12_4_ = fVar168;
                      auVar81 = blendvps(auVar80,auVar149,auVar58);
                      if (sVar43 != 8) {
                        pNVar52->ptr = sVar43;
                        pNVar52 = pNVar52 + 1;
                        paVar49->v[0] = (float)local_1b68._0_4_;
                        paVar49->v[1] = (float)local_1b68._4_4_;
                        paVar49->v[2] = fStack_1b60;
                        paVar49->v[3] = fStack_1b5c;
                        paVar49 = paVar49 + 1;
                      }
                      local_1b68._0_4_ = auVar81._0_4_;
                      local_1b68._4_4_ = auVar81._4_4_;
                      fStack_1b60 = auVar81._8_4_;
                      fStack_1b5c = auVar81._12_4_;
                      sVar43 = sVar9;
                    }
                  }
                } while ((sVar9 != 8) && (bVar53 = uVar44 < 3, uVar44 = uVar44 + 1, bVar53));
                iVar32 = 0;
                if (sVar43 == 8) {
LAB_0025ad3c:
                  pRVar39 = (RTCIntersectArguments *)0x0;
                  iVar32 = 4;
                }
                else {
                  auVar59._4_4_ = -(uint)((float)local_1b68._4_4_ < tray.tfar.field_0.v[1]);
                  auVar59._0_4_ = -(uint)((float)local_1b68._0_4_ < tray.tfar.field_0.v[0]);
                  auVar59._8_4_ = -(uint)(fStack_1b60 < tray.tfar.field_0.v[2]);
                  auVar59._12_4_ = -(uint)(fStack_1b5c < tray.tfar.field_0.v[3]);
                  uVar38 = movmskps((int)(root.ptr & 0xfffffffffffffff0),auVar59);
                  pRVar39 = (RTCIntersectArguments *)CONCAT71((uint7)(uint3)((uint)uVar38 >> 8),1);
                  if ((uint)POPCOUNT(uVar38) <= uVar37) {
                    pNVar52->ptr = sVar43;
                    pNVar52 = pNVar52 + 1;
                    paVar49->v[0] = (float)local_1b68._0_4_;
                    paVar49->v[1] = (float)local_1b68._4_4_;
                    paVar49->v[2] = fStack_1b60;
                    paVar49->v[3] = fStack_1b5c;
                    paVar49 = paVar49 + 1;
                    goto LAB_0025ad3c;
                  }
                }
                root.ptr = sVar43;
              } while ((char)pRVar39 != '\0');
            }
          }
        }
        paVar48 = paVar49;
      } while (iVar32 != 3);
      auVar92._0_4_ = uVar188 & terminated.field_0.i[0];
      auVar92._4_4_ = uVar192 & terminated.field_0.i[1];
      auVar92._8_4_ = auVar191._8_4_ & terminated.field_0.i[2];
      auVar92._12_4_ = auVar191._12_4_ & terminated.field_0.i[3];
      auVar92 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01feba00,auVar92);
      *(undefined1 (*) [16])(ray + 0x80) = auVar92;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }